

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O3

pair<llvm::DenseMapIterator<unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>,_false>,_bool>
* __thiscall
llvm::
DenseMapBase<llvm::DenseMap<unsigned_long,llvm::detail::DenseSetEmpty,llvm::DenseMapInfo<unsigned_long>,llvm::detail::DenseSetPair<unsigned_long>>,unsigned_long,llvm::detail::DenseSetEmpty,llvm::DenseMapInfo<unsigned_long>,llvm::detail::DenseSetPair<unsigned_long>>
::try_emplace<llvm::detail::DenseSetEmpty&>
          (pair<llvm::DenseMapIterator<unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>,_false>,_bool>
           *__return_storage_ptr__,void *this,unsigned_long *Key,DenseSetEmpty *Args)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  DenseSetPair<unsigned_long> *local_30;
  DenseSetPair<unsigned_long> *ConstFoundBucket;
  
  bVar3 = DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>,_unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>
          ::LookupBucketFor<unsigned_long>
                    ((DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>,_unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>
                      *)this,Key,&local_30);
  if (!bVar3) {
    local_30 = DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>,_unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>
               ::InsertIntoBucketImpl<unsigned_long>
                         ((DenseMapBase<llvm::DenseMap<unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>,_unsigned_long,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseSetPair<unsigned_long>_>
                           *)this,Key,Key,local_30);
    local_30->key = *Key;
  }
  uVar1 = *(uint *)((long)this + 0x10);
  lVar2 = *this;
  (__return_storage_ptr__->first).Ptr = local_30;
  (__return_storage_ptr__->first).End = (pointer)((ulong)uVar1 * 8 + lVar2);
  __return_storage_ptr__->second = !bVar3;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> try_emplace(const KeyT &Key, Ts &&... Args) {
    BucketT *TheBucket;
    if (LookupBucketFor(Key, TheBucket))
      return std::make_pair(
               makeIterator(TheBucket, getBucketsEnd(), *this, true),
               false); // Already in map.

    // Otherwise, insert the new element.
    TheBucket = InsertIntoBucket(TheBucket, Key, std::forward<Ts>(Args)...);
    return std::make_pair(
             makeIterator(TheBucket, getBucketsEnd(), *this, true),
             true);
  }